

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_filter.cpp
# Opt level: O1

uint64_t * read_data(char *filename,size_t *array_size,size_t maxline,bool printall)

{
  ulong uVar1;
  size_t *psVar2;
  uint64_t *puVar3;
  FILE *__stream;
  ulong uVar4;
  uint64_t *puVar5;
  clock_t cVar6;
  __off_t _Var7;
  undefined7 in_register_00000009;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  char *line;
  size_t line_capacity;
  byte *local_80;
  size_t *local_78;
  size_t local_70;
  undefined4 local_64;
  ulong local_60;
  uint64_t *local_58;
  long local_50;
  long local_48;
  ulong local_40;
  clock_t local_38;
  
  local_80 = (byte *)0x0;
  local_70 = 0;
  puVar3 = (uint64_t *)malloc(0x12c000000);
  if (puVar3 == (uint64_t *)0x0) {
    puVar5 = (uint64_t *)0x0;
    printf("Cannot allocate memory. Use a machine with plenty of RAM.");
  }
  else {
    *array_size = 0;
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      puVar5 = (uint64_t *)0x0;
      printf("Cannot read the input file %s.",filename);
      free(puVar3);
    }
    else {
      local_40 = maxline;
      local_38 = clock();
      uVar4 = getline((char **)&local_80,&local_70,__stream);
      if ((int)uVar4 != -1) {
        local_64 = (undefined4)CONCAT71(in_register_00000009,printall);
        local_60 = 0x25800000;
        local_50 = 3;
        local_48 = 2;
        do {
          if (0xf < (int)uVar4) {
            uVar4 = (long)digittoval[local_80[2]] << 4 | (long)digittoval[local_80[3]] |
                    (long)digittoval[local_80[1]] << 8 | (long)digittoval[*local_80] << 0xc;
            uVar11 = (int)digittoval[local_80[6]] << 4 | (int)digittoval[local_80[7]] |
                     (int)digittoval[local_80[5]] << 8 | (int)digittoval[local_80[4]] << 0xc;
            uVar8 = (int)digittoval[local_80[10]] << 4 | (int)digittoval[local_80[0xb]] |
                    (int)digittoval[local_80[9]] << 8 | (int)digittoval[local_80[8]] << 0xc;
            uVar10 = (int)digittoval[local_80[0xe]] << 4 | (int)digittoval[local_80[0xf]] |
                     (int)digittoval[local_80[0xd]] << 8 | (int)digittoval[local_80[0xc]] << 0xc;
            local_78 = array_size;
            if (((uVar8 | uVar10 | uVar11 | (uint)uVar4) & 0xffff0000) != 0) {
              printf("\r%256s","");
              fflush((FILE *)0x0);
              printf("Skipping line %s since it does not start with an hexadecimal\n",local_80);
              puVar3 = (uint64_t *)
                       (*(code *)((long)&DAT_00107010 + (long)(int)(&DAT_00107010)[local_48]))();
              return puVar3;
            }
            puVar5 = puVar3;
            if (local_60 <= *array_size) {
              local_60 = (*array_size * 3 >> 1) + 0x40;
              puVar5 = (uint64_t *)realloc(puVar3,local_60);
              if (puVar5 == (uint64_t *)0x0) {
                local_58 = puVar3;
                puts("Reallocation failed. Aborting.");
                lVar9 = 1;
                goto LAB_00102706;
              }
            }
            uVar4 = (ulong)uVar8 << 0x10 | (ulong)uVar11 << 0x20 | uVar4 << 0x30 | (ulong)uVar10;
            if ((char)local_64 != '\0') {
              printf("hexval = 0x%lx\n",uVar4);
            }
            psVar2 = local_78;
            uVar1 = *local_78;
            *local_78 = uVar1 + 1;
            puVar5[uVar1] = uVar4;
            if ((*local_78 != 0) && (*local_78 % 1000000 == 0)) {
              printf("\rread %zu hashes.");
            }
            if (*psVar2 == local_40) {
              printf("Reached the maximum number of lines %zu.\n");
              puVar3 = (uint64_t *)
                       (*(code *)((long)&DAT_00107010 + (long)(int)(&DAT_00107010)[local_50]))();
              return puVar3;
            }
            lVar9 = 0;
            fflush((FILE *)0x0);
LAB_00102706:
            puVar3 = (uint64_t *)
                     (*(code *)((long)&DAT_00107010 + (long)(int)(&DAT_00107010)[lVar9]))();
            return puVar3;
          }
          printf("\r%256s","");
          fflush((FILE *)0x0);
          printf("Skipping line %s since it is too short (%d)\n",local_80,uVar4 & 0xffffffff);
          uVar4 = getline((char **)&local_80,&local_70,__stream);
        } while ((int)uVar4 != -1);
      }
      cVar6 = clock();
      free(local_80);
      _Var7 = ftello(__stream);
      fclose(__stream);
      printf("\rI read %zu hashes in total (%.3f seconds).\n",
             (double)((float)(cVar6 - local_38) / 1e+06),*array_size);
      printf("Bytes read = %zu.\n",_Var7);
      puVar5 = puVar3;
    }
  }
  return puVar5;
}

Assistant:

uint64_t *read_data(const char *filename, size_t &array_size, size_t maxline,
                    bool printall) {
  char *line = NULL;
  size_t line_capacity = 0;
  int read;

  size_t array_capacity = 600 * 1024 * 1024;
  uint64_t *array = (uint64_t *)malloc(array_capacity * sizeof(uint64_t));
  if (array == NULL) {
    printf("Cannot allocate memory. Use a machine with plenty of RAM.");
    return nullptr;
  }
  array_size = 0;

  FILE *fp = fopen(filename, "r");
  if (fp == NULL) {
    printf("Cannot read the input file %s.", filename);
    free(array);
    return nullptr;
  }
  clock_t start = clock();

  while ((read = getline(&line, &line_capacity, fp)) != -1) {
    if (read < 16) {
      printf("\r%256s", "");
      fflush(NULL);
      printf("Skipping line %s since it is too short (%d)\n", line, read);
      continue;
    }
    uint64_t x1 = hex_to_u32_nocheck((const uint8_t *)line);
    uint64_t x2 = hex_to_u32_nocheck((const uint8_t *)line + 4);
    uint64_t x3 = hex_to_u32_nocheck((const uint8_t *)line + 8);
    uint64_t x4 = hex_to_u32_nocheck((const uint8_t *)line + 12);
    if ((x1 | x2 | x3 | x4) > 0xFFFF) {
      printf("\r%256s", "");
      fflush(NULL);
      printf("Skipping line %s since it does not start with an hexadecimal\n",
             line);
      continue;
    }
    if (array_size >= array_capacity) {
      array_capacity = 3 * array_size / 2 + 64;
      uint64_t *newarray = (uint64_t *)realloc(array, array_capacity);
      if (newarray == NULL) {
        printf("Reallocation failed. Aborting.\n");
        return nullptr;
      }
      array = newarray;
    }
    uint64_t hexval = (x1 << 48) | (x2 << 32) | (x3 << 16) | x4;
    if (printall)
      printf("hexval = 0x%" PRIx64 "\n", hexval);
    array[array_size++] = hexval;
    if ((array_size > 0) && ((array_size % 1000000) == 0)) {
      printf("\rread %zu hashes.", array_size);
    }
    if (array_size == maxline) {
      printf("Reached the maximum number of lines %zu.\n", maxline);
      break;
    }
    fflush(NULL);
  }
  clock_t end = clock();
  free(line);
  size_t numberofbytes = ftello(fp);
  fclose(fp);

  printf("\rI read %zu hashes in total (%.3f seconds).\n", array_size,
         (float)(end - start) / CLOCKS_PER_SEC);
  printf("Bytes read = %zu.\n", numberofbytes);
  return array;
}